

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::~QMainWindowLayout(QMainWindowLayout *this)

{
  QMainWindowLayoutState *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QTabBar_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007cf078;
  *(undefined ***)(this + 0x10) = &PTR__QMainWindowLayout_007cf180;
  this_00 = (QMainWindowLayoutState *)(this + 0x88);
  QMainWindowLayoutState::deleteAllLayoutItems(this_00);
  QMainWindowLayoutState::deleteCentralWidgetItem(this_00);
  if (*(long **)(this + 0x708) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x708) + 8))();
  }
  local_48.d = *(Data **)(this + 0x720);
  local_48.ptr = *(QTabBar ***)(this + 0x728);
  *(undefined8 *)(this + 0x720) = 0;
  *(undefined8 *)(this + 0x728) = 0;
  local_48.size = *(qsizetype *)(this + 0x730);
  *(undefined8 *)(this + 0x730) = 0;
  qDeleteAll<QList<QTabBar*>>((QList<QTabBar_*> *)&local_48);
  QArrayDataPointer<QTabBar_*>::~QArrayDataPointer(&local_48);
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)(this + 0x7f0));
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)(this + 0x7e0));
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)(this + 0x7b0));
  QWidgetAnimator::~QWidgetAnimator((QWidgetAnimator *)(this + 0x790));
  QBasicTimer::~QBasicTimer((QBasicTimer *)(this + 0x778));
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer((QArrayDataPointer<QWidget_*> *)(this + 0x748));
  QHash<QWidget_*,_QHashDummyValue>::~QHash((QHash<QWidget_*,_QHashDummyValue> *)(this + 0x740));
  QArrayDataPointer<QTabBar_*>::~QArrayDataPointer((QArrayDataPointer<QTabBar_*> *)(this + 0x720));
  QHash<QTabBar_*,_QHashDummyValue>::~QHash((QHash<QTabBar_*,_QHashDummyValue> *)(this + 0x718));
  std::unique_ptr<QMainWindowLayoutState,_std::default_delete<QMainWindowLayoutState>_>::~unique_ptr
            ((unique_ptr<QMainWindowLayoutState,_std::default_delete<QMainWindowLayoutState>_> *)
             (this + 0x6f8));
  QMainWindowLayoutState::~QMainWindowLayoutState((QMainWindowLayoutState *)(this + 0x3c0));
  QMainWindowLayoutState::~QMainWindowLayoutState(this_00);
  QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::~QMainWindowLayoutSeparatorHelper
            ((QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *)(this + 0x20));
  QLayout::~QLayout((QLayout *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMainWindowLayout::~QMainWindowLayout()
{
    layoutState.deleteAllLayoutItems();
    layoutState.deleteCentralWidgetItem();

    delete statusbar;

#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    // unusedTabBars contains unparented tab bars, which need to be removed manually.
    // ~QMainWindowTabBar() attempts to remove the bar from unusedTabBars
    // => move it out of the way first.
    const auto bars = std::move(unusedTabBars);
    qDeleteAll(bars);
#endif // QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
}